

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O3

EStatusCode __thiscall
PDFWriter::StartPDF(PDFWriter *this,string *inOutputFilePath,EPDFVersion inPDFVersion,
                   LogConfiguration *inLogConfiguration,PDFCreationSettings *inPDFCreationSettings)

{
  OutputFile *this_00;
  DocumentContext *this_01;
  bool bVar1;
  EStatusCode EVar2;
  IByteWriterWithPosition *inOutputStream;
  EPDFVersion inPDFVersion_00;
  
  inPDFVersion_00 = inPDFCreationSettings->WriteXrefAsXrefStream | ePDFVersion14;
  if (inPDFVersion != ePDFVersionUndefined) {
    inPDFVersion_00 = inPDFVersion;
  }
  SetupLog(this,inLogConfiguration);
  SetupCreationSettings(this,inPDFCreationSettings);
  this_00 = &this->mOutputFile;
  EVar2 = OutputFile::OpenFile(this_00,inOutputFilePath,false);
  if (EVar2 == eSuccess) {
    inOutputStream = OutputFile::GetOutputStream(this_00);
    ObjectsContext::SetOutputStream(&this->mObjectsContext,inOutputStream);
    this_01 = &this->mDocumentContext;
    PDFHummus::DocumentContext::SetOutputFileInformation(this_01,this_00);
    if ((inPDFCreationSettings->DocumentEncryptionOptions).ShouldEncrypt == true) {
      PDFHummus::DocumentContext::SetupEncryption
                (this_01,&inPDFCreationSettings->DocumentEncryptionOptions,inPDFVersion_00);
      bVar1 = PDFHummus::DocumentContext::SupportsEncryption(this_01);
      if (!bVar1) {
        OutputFile::CloseFile(this_00);
        return eFailure;
      }
    }
    this->mIsModified = false;
    EVar2 = PDFHummus::DocumentContext::WriteHeader(this_01,inPDFVersion_00);
    return EVar2;
  }
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::StartPDF(
							const std::string& inOutputFilePath,
							EPDFVersion inPDFVersion,
							const LogConfiguration& inLogConfiguration,
							const PDFCreationSettings& inPDFCreationSettings)
{
	EPDFVersion pdfVersion = thisOrDefaultVersion(inPDFVersion, inPDFCreationSettings.WriteXrefAsXrefStream);
	SetupLog(inLogConfiguration);
	SetupCreationSettings(inPDFCreationSettings);

	EStatusCode status = mOutputFile.OpenFile(inOutputFilePath);
	if(status != eSuccess)
		return status;

	mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
	mDocumentContext.SetOutputFileInformation(&mOutputFile);

	if (inPDFCreationSettings.DocumentEncryptionOptions.ShouldEncrypt) {
		mDocumentContext.SetupEncryption(inPDFCreationSettings.DocumentEncryptionOptions, pdfVersion);
		if (!mDocumentContext.SupportsEncryption()) {
			mOutputFile.CloseFile(); // close the file, to keep things clean
			return eFailure;
		}
	}

	mIsModified = false;

	return mDocumentContext.WriteHeader(pdfVersion);
}